

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O0

void rev_fak(kcc_joint *joint,joint_acceleration *qdd,gc_acc_twist *xdd)

{
  joint_axis jVar1;
  double local_40;
  double local_38;
  double local_30;
  joint_axis axis;
  gc_acc_twist *xdd_local;
  joint_acceleration *qdd_local;
  kcc_joint *joint_local;
  
  memset(xdd->angular_acceleration,0,0x18);
  memset(xdd->linear_acceleration,0,0x18);
  jVar1 = (joint->field_1).revolute_joint.axis;
  if (jVar1 == JOINT_AXIS_X) {
    local_30 = *qdd;
  }
  else {
    local_30 = 0.0;
  }
  (xdd->angular_acceleration->field_0).field_0.x = local_30;
  if (jVar1 == JOINT_AXIS_Y) {
    local_38 = *qdd;
  }
  else {
    local_38 = 0.0;
  }
  (xdd->angular_acceleration->field_0).field_0.y = local_38;
  if (jVar1 == JOINT_AXIS_Z) {
    local_40 = *qdd;
  }
  else {
    local_40 = 0.0;
  }
  (xdd->angular_acceleration->field_0).field_0.z = local_40;
  return;
}

Assistant:

static void rev_fak(
        const struct kcc_joint *joint,
        const joint_acceleration *qdd,
        struct gc_acc_twist *xdd)
{
    // initialize to 0.0
    memset(xdd->angular_acceleration, 0, sizeof(*xdd->angular_acceleration));
    memset(xdd->linear_acceleration, 0, sizeof(*xdd->linear_acceleration));

    enum joint_axis axis = joint->revolute_joint.axis;
    xdd->angular_acceleration->x = (axis == JOINT_AXIS_X) ? qdd[0] : 0.0;
    xdd->angular_acceleration->y = (axis == JOINT_AXIS_Y) ? qdd[0] : 0.0;
    xdd->angular_acceleration->z = (axis == JOINT_AXIS_Z) ? qdd[0] : 0.0;
}